

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

void __thiscall FFlagCVar::FFlagCVar(FFlagCVar *this,char *name,FIntCVar *realvar,DWORD bitval)

{
  uint32 *puVar1;
  bool bVar2;
  DWORD DVar3;
  int iVar4;
  
  iVar4 = 0;
  FBaseCVar::FBaseCVar(&this->super_FBaseCVar,name,0,(_func_void_FBaseCVar_ptr *)0x0);
  (this->super_FBaseCVar)._vptr_FBaseCVar = (_func_int **)&PTR__FBaseCVar_006f5ef0;
  this->ValueVar = realvar;
  this->BitVal = bitval;
  puVar1 = &(this->super_FBaseCVar).Flags;
  *(byte *)puVar1 = (byte)*puVar1 & 0x7f;
  if (bitval != 1) {
    if (bitval == 0) {
      __assert_fail("bitval != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_cvars.cpp"
                    ,0x43a,"FFlagCVar::FFlagCVar(const char *, FIntCVar &, DWORD)");
    }
    iVar4 = 0;
    DVar3 = bitval;
    do {
      iVar4 = iVar4 + 1;
      bVar2 = 3 < DVar3;
      DVar3 = DVar3 >> 1;
    } while (bVar2);
  }
  this->BitNum = iVar4;
  if (1 << ((byte)iVar4 & 0x1f) == bitval) {
    return;
  }
  __assert_fail("(1u << BitNum) == BitVal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_cvars.cpp"
                ,0x443,"FFlagCVar::FFlagCVar(const char *, FIntCVar &, DWORD)");
}

Assistant:

FFlagCVar::FFlagCVar (const char *name, FIntCVar &realvar, DWORD bitval)
: FBaseCVar (name, 0, NULL),
ValueVar (realvar),
BitVal (bitval)
{
	int bit;

	Flags &= ~CVAR_ISDEFAULT;

	assert (bitval != 0);

	bit = 0;
	while ((bitval >>= 1) != 0)
	{
		++bit;
	}
	BitNum = bit;

	assert ((1u << BitNum) == BitVal);
}